

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::SetWritable
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *this,
          DynamicObject *instance,PropertyId propertyId,BOOL value)

{
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  Entry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
  *pEVar1;
  JavascriptLibrary *pJVar2;
  ScriptContext *scriptContext;
  code *pcVar3;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_01;
  bool bVar4;
  uint uVar5;
  BOOL BVar6;
  int iVar7;
  PropertyId propertyId_00;
  undefined4 *puVar8;
  DynamicTypeHandler *pDVar9;
  SimpleDictionaryPropertyDescriptor<int> *descriptor;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *local_48;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x7cd,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  local_40 = ScriptContext::GetPropertyName
                       ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  this_00 = (this->propertyMap).ptr;
  uVar5 = JsUtil::
          BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
          ::FindEntryWithKey<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                      *)this_00,&local_40);
  if ((int)uVar5 < 0) {
    bVar4 = DynamicObject::HasObjectArray(instance);
    iVar7 = 1;
    if ((bVar4) && (local_40->isNumeric == true)) {
      pDVar9 = ConvertToTypeWithItemAttributes(this,instance);
      iVar7 = (*pDVar9->_vptr_DynamicTypeHandler[0x2a])
                        (pDVar9,instance,(ulong)(uint)propertyId,(ulong)(uint)value);
    }
  }
  else {
    pEVar1 = (this_00->entries).ptr;
    iVar7 = 1;
    if ((pEVar1[uVar5].
         super_DictionaryEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
         .
         super_CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
         .
         super_KeyValueEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
         .
         super_ValueEntry<Js::SimpleDictionaryPropertyDescriptor<int>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>_>
         .
         super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
         .value.Attributes & 0x10) == 0) {
      descriptor = (SimpleDictionaryPropertyDescriptor<int> *)(pEVar1 + uVar5);
      propertyRecord = (PropertyRecord *)(instance->super_RecyclableObject).type.ptr;
      if (value == 0) {
        BVar6 = ClearAttribute(this,instance,descriptor,'\x04');
        if (BVar6 != 0) {
          DynamicObject::ChangeTypeIf(instance,(Type *)propertyRecord);
          pDVar9 = DynamicTypeHandler::GetCurrentTypeHandler(instance);
          pJVar2 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
          propertyRecord = (PropertyRecord *)&pJVar2->typesWithOnlyWritablePropertyProtoChain;
          Memory::Recycler::WBSetBit((char *)&local_48);
          local_48 = (PrototypeChainCache<Js::OnlyWritablePropertyCache> *)propertyRecord;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_48);
          this_01 = local_48;
          scriptContext = (pJVar2->super_JavascriptLibraryBase).scriptContext.ptr;
          DynamicTypeHandler::SetHasOnlyWritableDataProperties(pDVar9,false);
          if ((pDVar9->flags & 0x20) != 0) {
            propertyId_00 = DynamicTypeHandler::TMapKey_GetPropertyId(scriptContext,propertyId);
            ScriptContext::InvalidateStoreFieldCaches(scriptContext,propertyId_00);
            PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(this_01);
          }
        }
      }
      else {
        BVar6 = SetAttribute(this,instance,descriptor,'\x04');
        if (BVar6 != 0) {
          DynamicObject::ChangeTypeIf(instance,(Type *)propertyRecord);
        }
      }
    }
  }
  return iVar7;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetWritable(DynamicObject* instance, PropertyId propertyId, BOOL value)
    {
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (!propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            // Upgrade type handler if set objectArray item attribute.
            // Only check numeric propertyId if objectArray available.
            if (instance->HasObjectArray() && propertyRecord->IsNumeric())
            {
                return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::ConvertToTypeWithItemAttributes(instance)
                    ->SetWritable(instance, propertyId, value);
            }
            return true;
        }

        if (descriptor->Attributes & PropertyLetConstGlobal)
        {
            return true;
        }

        const Type* oldType = instance->GetType();
        if (value)
        {
            if (SetAttribute(instance, descriptor, PropertyWritable))
            {
                instance->ChangeTypeIf(oldType); // Ensure type change to invalidate caches
            }
        }
        else
        {
            if (ClearAttribute(instance, descriptor, PropertyWritable))
            {
                instance->ChangeTypeIf(oldType); // Ensure type change to invalidate caches

                // Clearing the attribute may have changed the type handler, so make sure
                // we access the current one.
                DynamicTypeHandler *const typeHandler = GetCurrentTypeHandler(instance);
                JavascriptLibrary * library = instance->GetLibrary();
                library->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(typeHandler, PropertyNone, propertyId, library->GetScriptContext());
            }
        }
        return true;
    }